

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

bool __thiscall ON_Buffer::ChangeSize(ON_Buffer *this,ON__UINT64 buffer_size)

{
  ON_BUFFER_SEGMENT *pOVar1;
  ON_BUFFER_SEGMENT *pOVar2;
  ON_BUFFER_SEGMENT *pOVar3;
  ON__UINT64 offset;
  ulong uVar4;
  bool bVar5;
  ulong in_RAX;
  long lVar6;
  uchar zero_byte;
  undefined8 uStack_28;
  
  if (buffer_size == 0) {
    pOVar3 = this->m_last_segment;
    this->m_buffer_size = 0;
    this->m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
    this->m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
    this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    while (pOVar3 != (ON_BUFFER_SEGMENT *)0x0) {
      pOVar1 = pOVar3->m_prev_segment;
      pOVar2 = (ON_BUFFER_SEGMENT *)pOVar3->m_segment_buffer;
      if (pOVar2 != pOVar3 + 1 && pOVar2 != (ON_BUFFER_SEGMENT *)0x0) {
        onfree(pOVar2);
      }
      onfree(pOVar3);
      pOVar3 = pOVar1;
    }
  }
  else if (buffer_size < this->m_buffer_size) {
    this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    if ((this->m_first_segment == (ON_BUFFER_SEGMENT *)0x0) ||
       (this->m_last_segment == (ON_BUFFER_SEGMENT *)0x0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x293,"","Corrupt ON_Buffer");
      return false;
    }
    pOVar3 = this->m_last_segment;
    while (pOVar3 != (ON_BUFFER_SEGMENT *)0x0) {
      lVar6 = buffer_size - pOVar3->m_segment_position0;
      if (pOVar3->m_segment_position0 <= buffer_size && lVar6 != 0) {
        uVar4 = pOVar3->m_segment_position1;
        if (uVar4 < buffer_size) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,0x29d,"","Corrupt ON_Buffer.");
          uVar4 = this->m_last_segment->m_segment_position1;
          if (uVar4 < this->m_buffer_size) {
            this->m_buffer_size = uVar4;
          }
          this->m_last_segment->m_next_segment = (ON_BUFFER_SEGMENT *)0x0;
          if (this->m_buffer_size < this->m_current_position) {
            this->m_current_position = this->m_buffer_size;
          }
          return false;
        }
        if ((buffer_size <= uVar4 && uVar4 - buffer_size != 0) &&
            pOVar3->m_segment_buffer != (uchar *)0x0) {
          memset(pOVar3->m_segment_buffer + lVar6,0,uVar4 - buffer_size);
        }
        this->m_buffer_size = buffer_size;
        break;
      }
      pOVar1 = pOVar3->m_prev_segment;
      if (pOVar1 != (ON_BUFFER_SEGMENT *)0x0) {
        pOVar1->m_next_segment = (ON_BUFFER_SEGMENT *)0x0;
      }
      pOVar2 = (ON_BUFFER_SEGMENT *)pOVar3->m_segment_buffer;
      if (pOVar2 != pOVar3 + 1 && pOVar2 != (ON_BUFFER_SEGMENT *)0x0) {
        onfree(pOVar2);
      }
      onfree(this->m_last_segment);
      this->m_last_segment = pOVar1;
      pOVar3 = pOVar1;
    }
  }
  else if (this->m_buffer_size < buffer_size) {
    offset = this->m_current_position;
    uStack_28 = in_RAX;
    bVar5 = Seek(this,buffer_size - 1,0);
    if (bVar5) {
      uStack_28 = uStack_28 & 0xffffffffffffff;
      Write(this,1,(void *)((long)&uStack_28 + 7));
    }
    Seek(this,offset,0);
  }
  return this->m_buffer_size == buffer_size;
}

Assistant:

bool ON_Buffer::ChangeSize(ON__UINT64 buffer_size)
{
  if ( buffer_size <= 0 )
  {
    struct ON_BUFFER_SEGMENT* p0 = m_last_segment;
    struct ON_BUFFER_SEGMENT* p1 = 0;
    m_buffer_size = 0;
    m_first_segment = 0;
    m_last_segment = 0;
    m_current_segment = 0;

    // free in reverse order of allocation
    while ( 0 != p0 )
    {
      p1 = p0->m_prev_segment;
      if ( 0 != p0->m_segment_buffer && (void*)(p0->m_segment_buffer) != (void*)(p0+1) )
        onfree(p0->m_segment_buffer);
      onfree(p0);
      p0 = p1;
    }
  }
  else if ( buffer_size < m_buffer_size )
  {
    m_current_segment = 0;

    if ( 0 == m_first_segment || 0 == m_last_segment )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return false;
    }

    while ( 0 != m_last_segment )
    {
      if ( m_last_segment->m_segment_position0 < buffer_size )
      {
        if ( buffer_size > m_last_segment->m_segment_position1 )
        {
          ON_ERROR("Corrupt ON_Buffer.");
          // Set m_buffer_size and m_last_segment to valid values
          // to prevent possible crashes if the return code is
          // ignored.
          if ( m_buffer_size > m_last_segment->m_segment_position1 )
            m_buffer_size = m_last_segment->m_segment_position1;
          m_last_segment->m_next_segment = 0;
          if ( m_current_position > m_buffer_size )
            m_current_position = m_buffer_size;
          return false;
        }
        if ( 0 != m_last_segment->m_segment_buffer && m_last_segment->m_segment_position1 > buffer_size )
        {
          memset(m_last_segment->m_segment_buffer + (buffer_size - m_last_segment->m_segment_position0),
                 0,
                 (size_t)(m_last_segment->m_segment_position1 - buffer_size)
                 );
        }
        m_buffer_size = buffer_size;
        break;
      }
      struct ON_BUFFER_SEGMENT* p = m_last_segment->m_prev_segment;
      if ( 0 != p )
        p->m_next_segment = 0;
      if ( 0 != m_last_segment->m_segment_buffer && (void*)(m_last_segment->m_segment_buffer) != (void*)(m_last_segment+1) )
        onfree(m_last_segment->m_segment_buffer);
      onfree(m_last_segment);
      m_last_segment = p;
    }
  }
  else if ( buffer_size > m_buffer_size )
  {
    // save current position;
    const ON__UINT64 saved_pos = CurrentPosition();
    if ( SeekFromStart(buffer_size-1) )
    {
      // calling Write with the current position at buffer_size-1
      // will pad with zeros from offset m_buffer_size to 
      // offset buffer_size-2, write a zero at offset buffer_size-1,
      // and set m_buffer_size to buffer size.
      const unsigned char zero_byte = 0;
      Write(1,&zero_byte);
    }
    // restore current position.
    SeekFromStart(saved_pos);
  }

  return (buffer_size == m_buffer_size);
}